

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Add_Remove_Inter_To_Extra_Window(Am_Object *inter,Am_Object *window,bool add,bool want_move)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  int local_40;
  int local_3c;
  int third_priority;
  int second_priority;
  float main_priority;
  Am_Object local_28;
  Am_Object owner;
  bool want_move_local;
  bool add_local;
  Am_Object *window_local;
  Am_Object *inter_local;
  
  owner.data._6_1_ = want_move;
  owner.data._7_1_ = add;
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)inter);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    pAVar2 = Am_Object::Get(inter,0xcd,0);
    third_priority = (int)Am_Value::operator_cast_to_float(pAVar2);
    pAVar2 = Am_Object::Get(&local_28,0x86,0);
    local_3c = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(&local_28,0x85,0);
    local_40 = Am_Value::operator_cast_to_int(pAVar2);
    if ((owner.data._7_1_ & 1) == 0) {
      Am_Object::Am_Object(&local_58,inter);
      Am_Object::Am_Object(&local_60,window);
      clear_priority_list_for_window(&local_58,&local_60);
      Am_Object::~Am_Object(&local_60);
      Am_Object::~Am_Object(&local_58);
    }
    else {
      Am_Object::Am_Object(&local_48,inter);
      Am_Object::Am_Object(&local_50,window);
      add_priority_list_for_window
                (&local_48,&local_50,(float)third_priority,local_3c,local_40,true,true);
      Am_Object::~Am_Object(&local_50);
      Am_Object::~Am_Object(&local_48);
    }
  }
  Am_Object::Am_Object(&local_68,window);
  set_want_move_one_win(&local_68,(bool)(owner.data._6_1_ & 1));
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
Am_Add_Remove_Inter_To_Extra_Window(Am_Object inter, Am_Object window, bool add,
                                    bool want_move)
{
  Am_Object owner = inter.Get_Owner();
  if (owner.Valid()) {
    float main_priority = inter.Get(Am_PRIORITY);
    int second_priority = owner.Get(Am_OWNER_DEPTH);
    int third_priority = owner.Get(Am_RANK);
    if (add) {
      add_priority_list_for_window(inter, window, main_priority,
                                   second_priority, third_priority, true, true);
    } else
      clear_priority_list_for_window(inter, window);
  }
  set_want_move_one_win(window, want_move);
}